

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

FxExpression * __thiscall FxDotCross::Resolve(FxDotCross *this,FCompileContext *ctx)

{
  FxExpression *pFVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  PStruct *pPVar3;
  char *pcVar4;
  
  if ((this->super_FxExpression).isresolved == false) {
    (this->super_FxExpression).isresolved = true;
    pFVar1 = this->left;
    if (pFVar1 != (FxExpression *)0x0) {
      iVar2 = (*pFVar1->_vptr_FxExpression[2])(pFVar1,ctx);
      this->left = (FxExpression *)CONCAT44(extraout_var,iVar2);
    }
    pFVar1 = this->right;
    if (pFVar1 != (FxExpression *)0x0) {
      iVar2 = (*pFVar1->_vptr_FxExpression[2])(pFVar1,ctx);
      this->right = (FxExpression *)CONCAT44(extraout_var_00,iVar2);
    }
    if ((this->right != (FxExpression *)0x0) && (this->left != (FxExpression *)0x0)) {
      pPVar3 = (PStruct *)this->left->ValueType;
      if ((pPVar3 == TypeVector3 || pPVar3 == TypeVector2) &&
         ((pPVar3 == (PStruct *)this->right->ValueType &&
          (this->Operator != 0x167 || pPVar3 == TypeVector3)))) {
        pPVar3 = TypeVector3;
        if (this->Operator != 0x167) {
          pPVar3 = (PStruct *)TypeFloat64;
        }
        (this->super_FxExpression).ValueType = (PType *)pPVar3;
        return &this->super_FxExpression;
      }
      pcVar4 = "dot-";
      if (this->Operator == 0x167) {
        pcVar4 = "cross-";
      }
      FScriptPosition::Message
                (&(this->super_FxExpression).ScriptPosition,2,"Incompatible operants for %sproduct",
                 pcVar4);
    }
    (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
    this = (FxDotCross *)0x0;
  }
  return &this->super_FxExpression;
}

Assistant:

FxExpression *FxDotCross::Resolve(FCompileContext& ctx)
{
	CHECKRESOLVED();
	RESOLVE(left, ctx);
	RESOLVE(right, ctx);
	ABORT(right && left);

	if (!left->IsVector() || left->ValueType != right->ValueType || (Operator == TK_Cross && left->ValueType != TypeVector3))
	{
		ScriptPosition.Message(MSG_ERROR, "Incompatible operants for %sproduct", Operator == TK_Cross ? "cross-" : "dot-");
		delete this;
		return nullptr;
	}
	ValueType = Operator == TK_Cross ? (PType*)TypeVector3 : TypeFloat64;
	return this;
}